

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Updater.cpp
# Opt level: O2

void __thiscall Updater::~Updater(Updater *this)

{
  *(undefined ***)this = &PTR_metaObject_0011b4f0;
  if (this->m_downloader != (Downloader *)0x0) {
    (**(code **)(*(long *)this->m_downloader + 0x20))();
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_downloadPassword).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_downloadUserName).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_latestVersion).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_moduleVersion).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_downloadUrl).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_moduleName).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_changelog).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_platform).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_openUrl).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_userAgentString).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_url).d);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

Updater::~Updater()
{
   delete m_downloader;
}